

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O0

LLVMValueRef CompileLlvmStringLiteral(LlvmCompilationContext *ctx,ExprStringLiteral *node)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  LLVMValueRef pLVar3;
  LLVMValueRef result;
  uint i;
  char *value;
  uint size;
  ExprStringLiteral *node_local;
  LlvmCompilationContext *ctx_local;
  char *__s;
  
  uVar1 = node->length + 4 & 0xfffffffc;
  iVar2 = (*ctx->allocator->_vptr_Allocator[2])();
  __s = (char *)CONCAT44(extraout_var,iVar2);
  memset(__s,0,(ulong)uVar1);
  for (result._4_4_ = 0; result._4_4_ < node->length; result._4_4_ = result._4_4_ + 1) {
    __s[result._4_4_] = node->value[result._4_4_];
  }
  pLVar3 = LLVMConstStringInContext(ctx->context,__s,uVar1,true);
  pLVar3 = CheckType(ctx,&node->super_ExprBase,pLVar3);
  return pLVar3;
}

Assistant:

LLVMValueRef CompileLlvmStringLiteral(LlvmCompilationContext &ctx, ExprStringLiteral *node)
{
	unsigned size = node->length + 1;

	// Align to 4
	size = (size + 3) & ~3;

	char *value = (char*)ctx.allocator->alloc(size);
	memset(value, 0, size);

	for(unsigned i = 0; i < node->length; i++)
		value[i] = node->value[i];

	LLVMValueRef result = LLVMConstStringInContext(ctx.context, value, size, true);

	return CheckType(ctx, node, result);
}